

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kyber.cc
# Opt level: O0

uint16_t reduce_once(uint16_t x)

{
  ushort uVar1;
  int iVar2;
  uint16_t mask;
  uint16_t subtracted;
  uint16_t x_local;
  
  iVar2 = constant_time_declassify_int((uint)(x < 0x1a02));
  if (iVar2 != 0) {
    uVar1 = -(short)((int)(uint)(ushort)(x - 0xd01) >> 0xf);
    return uVar1 & x | (uVar1 ^ 0xffff) & x - 0xd01;
  }
  __assert_fail("constant_time_declassify_int(x < 2 * kPrime)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/kyber/kyber.cc"
                ,0x8a,"uint16_t reduce_once(uint16_t)");
}

Assistant:

static uint16_t reduce_once(uint16_t x) {
  declassify_assert(x < 2 * kPrime);
  const uint16_t subtracted = x - kPrime;
  uint16_t mask = 0u - (subtracted >> 15);
  // Although this is a constant-time select, we omit a value barrier here.
  // Value barriers impede auto-vectorization (likely because it forces the
  // value to transit through a general-purpose register). On AArch64, this is a
  // difference of 2x.
  //
  // We usually add value barriers to selects because Clang turns consecutive
  // selects with the same condition into a branch instead of CMOV/CSEL. This
  // condition does not occur in Kyber, so omitting it seems to be safe so far,
  // but see |scalar_centered_binomial_distribution_eta_2_with_prf|.
  return (mask & x) | (~mask & subtracted);
}